

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O1

void animation_timer_method_proc(Am_Object *inter,Am_Time *elapsed_time)

{
  Am_Value *in_value;
  Am_Value value;
  Am_Value local_30;
  Am_Value local_20;
  
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(inter,0xc5,1);
  Am_Value::operator=(&local_30,in_value);
  Am_Value::Am_Value(&local_20,&local_30);
  call_all_commands(&local_20,200,inter,elapsed_time,false);
  Am_Value::~Am_Value(&local_20);
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, animation_timer_method,
                 (Am_Object inter, const Am_Time &elapsed_time))
{
  Am_Value value;
  value = inter.Peek(Am_COMMAND);
  call_all_commands(value, Am_INTERIM_DO_METHOD, inter, elapsed_time, false);
}